

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cc
# Opt level: O0

uint32_t __thiscall re2c::Skeleton::rule2key(Skeleton *this,rule_rank_t r)

{
  byte bVar1;
  unsigned_short uVar2;
  Skeleton *this_local;
  rule_rank_t r_local;
  
  if (this->sizeof_key == 1) {
    bVar1 = rule2key<unsigned_char>(r);
    this_local._4_4_ = (uint)bVar1;
  }
  else if (this->sizeof_key == 2) {
    uVar2 = rule2key<unsigned_short>(r);
    this_local._4_4_ = (uint)uVar2;
  }
  else {
    this_local._4_4_ = rule2key<unsigned_int>(r);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t Skeleton::rule2key (rule_rank_t r) const
{
	switch (sizeof_key)
	{
		default: // shouldn't happen
		case 4: return rule2key<uint32_t> (r);
		case 2: return rule2key<uint16_t> (r);
		case 1: return rule2key<uint8_t>  (r);
	}
}